

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::hoverMoveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  QPointer<QWidget> *this_00;
  QGraphicsProxyWidgetPrivate *this_01;
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  QPoint QVar4;
  QWidget *leave;
  long in_FS_OFFSET;
  QPointF local_48;
  QSizeF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_01->widget);
  if (bVar2) {
    local_38 = QGraphicsWidget::size((QGraphicsWidget *)this);
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    QGraphicsSceneHoverEvent::pos(event);
    cVar3 = QRectF::contains(&local_48);
    if (cVar3 != '\0') {
      QWeakPointer<QObject>::assign<QObject>(&(this_01->embeddedMouseGrabber).wp,(QObject *)0x0);
      QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(this_01,event);
      goto LAB_0059004c;
    }
  }
  this_00 = &this_01->lastWidgetUnderMouse;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      leave = (QWidget *)0x0;
    }
    else {
      leave = (QWidget *)(this_01->lastWidgetUnderMouse).wp.value;
    }
    QVar4 = QGraphicsSceneHoverEvent::screenPos(event);
    local_48.xp = (qreal)QVar4.xp.m_i.m_i;
    local_48.yp = (qreal)QVar4.yp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave((QWidget *)0x0,leave,&local_48);
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)0x0);
  }
LAB_0059004c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::hoverMoveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::hoverMoveEvent");
#endif
    // Ignore events on the window frame.
    if (!d->widget || !rect().contains(event->pos())) {
        if (d->lastWidgetUnderMouse) {
            QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
            d->lastWidgetUnderMouse = nullptr;
        }
        return;
    }

    d->embeddedMouseGrabber = nullptr;
    d->sendWidgetMouseEvent(event);
}